

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

void __thiscall jrtplib::RTPSession::~RTPSession(RTPSession *this)

{
  ~RTPSession(this);
  operator_delete(this,0x107b8);
  return;
}

Assistant:

RTPSession::~RTPSession()
{
	Destroy();

	if (deletertprnd)
		delete rtprnd;
}